

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O3

void __thiscall
ContainerAlgorithms::
DefaultDeleter<std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>,_false>
::operator()(DefaultDeleter<std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>,_false>
             *this,value_type value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  if (value != (value_type)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&value->Files);
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&value->Condition);
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&value->OutputFileExpr);
    pcVar2 = (value->Input)._M_dataplus._M_p;
    paVar1 = &(value->Input).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(value,0x50);
  return;
}

Assistant:

void operator()(typename Range::value_type value) const { delete value; }